

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtraData.cpp
# Opt level: O0

void __thiscall ExtraData::parseColorTableUtils(ExtraData *this,int posStart)

{
  ostream *poVar1;
  reference pvVar2;
  int posStart_local;
  ExtraData *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)Utils::defaultOffset_abi_cxx11_);
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&(this->CONSOLE_PROPS).ColorTable,(long)posStart);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pvVar2);
  poVar1 = std::operator<<(poVar1," ");
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&(this->CONSOLE_PROPS).ColorTable,(long)(posStart + 1));
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pvVar2);
  poVar1 = std::operator<<(poVar1," ");
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&(this->CONSOLE_PROPS).ColorTable,(long)(posStart + 2));
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pvVar2);
  poVar1 = std::operator<<(poVar1," ");
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&(this->CONSOLE_PROPS).ColorTable,(long)(posStart + 3));
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pvVar2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void ExtraData::parseColorTableUtils(int posStart) {
    cout << Utils::defaultOffset << CONSOLE_PROPS.ColorTable[posStart] << " " << CONSOLE_PROPS.ColorTable[posStart + 1] << " " <<
         CONSOLE_PROPS.ColorTable[posStart + 2] << " " << CONSOLE_PROPS.ColorTable[posStart + 3] << endl;
}